

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

Long __thiscall amrex::BoxArray::numPts(BoxArray *this)

{
  long *plVar1;
  BATType BVar2;
  element_type *peVar3;
  long lVar4;
  long lVar5;
  IndexType IVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Long LVar10;
  int dir_1;
  uint uVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  Long LVar15;
  int dir;
  long lVar16;
  ulong uVar17;
  int iVar18;
  IntVect IVar19;
  Box result;
  Box bx;
  ulong local_40;
  int local_38;
  
  peVar3 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar9 = ((long)*(pointer *)
                  ((long)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data + 8) -
          *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data) / 0x1c;
  BVar2 = (this->m_bat).m_bat_type;
  iVar14 = (int)uVar9;
  if (BVar2 == bndryReg) {
    uVar17 = 0;
    uVar9 = uVar9 & 0xffffffff;
    if (iVar14 < 1) {
      uVar9 = uVar17;
    }
    LVar15 = 0;
    for (; uVar9 * 0x1c - uVar17 != 0; uVar17 = uVar17 + 0x1c) {
      BATbndryReg::operator()
                (&bx,&(this->m_bat).m_op.m_bndryReg,
                 (Box *)(*(long *)&(peVar3->m_abox).
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data + uVar17));
      LVar10 = Box::numPts(&bx);
      LVar15 = LVar15 + LVar10;
    }
  }
  else if (BVar2 == null) {
    uVar17 = 0;
    uVar9 = uVar9 & 0xffffffff;
    if (iVar14 < 1) {
      uVar9 = uVar17;
    }
    LVar15 = 0;
    for (; uVar9 * 0x1c - uVar17 != 0; uVar17 = uVar17 + 0x1c) {
      LVar10 = Box::numPts((Box *)(*(long *)&(peVar3->m_abox).
                                             super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                             super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                             ._M_impl.super__Vector_impl_data + uVar17));
      LVar15 = LVar15 + LVar10;
    }
  }
  else {
    IVar6 = BATransformer::index_type(&this->m_bat);
    IVar19 = BATransformer::coarsen_ratio(&this->m_bat);
    iVar13 = IVar19.vect[2];
    local_40 = IVar19.vect._0_8_;
    iVar18 = IVar19.vect[0];
    uVar17 = 0;
    uVar9 = uVar9 & 0xffffffff;
    if (iVar14 < 1) {
      uVar9 = uVar17;
    }
    local_38 = iVar13;
    LVar15 = 0;
    for (; uVar17 != uVar9; uVar17 = uVar17 + 1) {
      lVar12 = *(long *)&(peVar3->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data;
      plVar1 = (long *)(lVar12 + uVar17 * 0x1c);
      lVar16 = *plVar1;
      lVar4 = plVar1[1];
      plVar1 = (long *)(lVar12 + 0xc + uVar17 * 0x1c);
      lVar12 = *plVar1;
      lVar5 = plVar1[1];
      result.bigend.vect[1] = (int)((ulong)lVar12 >> 0x20);
      result.bigend.vect[2] = (int)lVar5;
      result.btype.itype = (int)((ulong)lVar5 >> 0x20);
      result.smallend.vect[2] = (int)lVar4;
      result.bigend.vect[0] = (int)((ulong)lVar4 >> 0x20);
      iVar14 = IVar19.vect[1];
      result.smallend.vect[1] = (int)((ulong)lVar16 >> 0x20);
      uVar8 = result.smallend.vect[1];
      if (IVar19.vect._0_8_ >> 0x20 == 1 && iVar18 == 1) {
        result.smallend.vect._0_8_ = lVar16;
        if (iVar13 != 1) goto LAB_0041b082;
      }
      else {
        result.smallend.vect[0] = (int)lVar16;
        if (iVar18 != 1) {
          if (iVar18 == 4) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 2;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
            }
          }
          else if (iVar18 == 2) {
            if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = result.smallend.vect[0] >> 1;
            }
            else {
              result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
            }
          }
          else if (result.smallend.vect[0] < 0) {
            result.smallend.vect[0] = ~(~result.smallend.vect[0] / iVar18);
          }
          else {
            result.smallend.vect[0] = result.smallend.vect[0] / iVar18;
          }
        }
        if (iVar14 != 1) {
          if (iVar14 == 4) {
            if (lVar16 < 0) {
              uVar8 = result.smallend.vect[1] >> 2;
            }
            else {
              uVar8 = (uint)result.smallend.vect[1] >> 2;
            }
          }
          else if (iVar14 == 2) {
            if (lVar16 < 0) {
              uVar8 = result.smallend.vect[1] >> 1;
            }
            else {
              uVar8 = (uint)result.smallend.vect[1] >> 1;
            }
          }
          else if (lVar16 < 0) {
            uVar8 = ~(~result.smallend.vect[1] / iVar14);
          }
          else {
            uVar8 = result.smallend.vect[1] / iVar14;
          }
        }
LAB_0041b082:
        result.smallend.vect[1] = uVar8;
        if (iVar13 != 1) {
          if (iVar13 == 4) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 2;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
            }
          }
          else if (iVar13 == 2) {
            if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = result.smallend.vect[2] >> 1;
            }
            else {
              result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
            }
          }
          else if (result.smallend.vect[2] < 0) {
            result.smallend.vect[2] = ~(~result.smallend.vect[2] / iVar13);
          }
          else {
            result.smallend.vect[2] = result.smallend.vect[2] / iVar13;
          }
        }
        result.btype.itype = (uint)((ulong)lVar5 >> 0x20);
        result.bigend.vect[2] = (int)lVar5;
        if (result.btype.itype == 0) {
          uVar8 = result.bigend.vect[0];
          if (iVar18 != 1) {
            if (iVar18 == 4) {
              uVar8 = result.bigend.vect[0] >> 2;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (iVar18 == 2) {
              uVar8 = result.bigend.vect[0] >> 1;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar8 = ~(~result.bigend.vect[0] / iVar18);
            }
            else {
              uVar8 = result.bigend.vect[0] / iVar18;
            }
          }
          result.bigend.vect[0] = uVar8;
          uVar8 = result.bigend.vect[1];
          if (iVar14 != 1) {
            if (iVar14 == 4) {
              uVar8 = result.bigend.vect[1] >> 2;
              if (-1 < lVar12) {
                uVar8 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (iVar14 == 2) {
              uVar8 = result.bigend.vect[1] >> 1;
              if (-1 < lVar12) {
                uVar8 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar12 < 0) {
              uVar8 = ~(~result.bigend.vect[1] / iVar14);
            }
            else {
              uVar8 = result.bigend.vect[1] / iVar14;
            }
          }
          result.bigend.vect[1] = uVar8;
          uVar8 = result.bigend.vect[2];
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              uVar8 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar8 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (iVar13 == 2) {
              uVar8 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar8 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar8 = ~(~result.bigend.vect[2] / iVar13);
            }
            else {
              uVar8 = result.bigend.vect[2] / iVar13;
            }
          }
        }
        else {
          bx.smallend.vect[0] = 0;
          bx.smallend.vect[1] = 0;
          bx.smallend.vect[2] = 0;
          for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
            if (((result.btype.itype >> ((uint)lVar16 & 0x1f) & 1) != 0) &&
               (result.bigend.vect[lVar16] % *(int *)((long)&local_40 + lVar16 * 4) != 0)) {
              bx.smallend.vect[lVar16] = 1;
            }
          }
          uVar8 = result.bigend.vect[0];
          if (iVar18 != 1) {
            if (iVar18 == 4) {
              uVar8 = result.bigend.vect[0] >> 2;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 2;
              }
            }
            else if (iVar18 == 2) {
              uVar8 = result.bigend.vect[0] >> 1;
              if (-1 < lVar4) {
                uVar8 = (uint)result.bigend.vect[0] >> 1;
              }
            }
            else if (lVar4 < 0) {
              uVar8 = ~(~result.bigend.vect[0] / iVar18);
            }
            else {
              uVar8 = result.bigend.vect[0] / iVar18;
            }
          }
          uVar11 = result.bigend.vect[1];
          if (iVar14 != 1) {
            if (iVar14 == 4) {
              uVar11 = result.bigend.vect[1] >> 2;
              if (-1 < lVar12) {
                uVar11 = (uint)result.bigend.vect[1] >> 2;
              }
            }
            else if (iVar14 == 2) {
              uVar11 = result.bigend.vect[1] >> 1;
              if (-1 < lVar12) {
                uVar11 = (uint)result.bigend.vect[1] >> 1;
              }
            }
            else if (lVar12 < 0) {
              uVar11 = ~(~result.bigend.vect[1] / iVar14);
            }
            else {
              uVar11 = result.bigend.vect[1] / iVar14;
            }
          }
          uVar7 = result.bigend.vect[2];
          if (iVar13 != 1) {
            if (iVar13 == 4) {
              uVar7 = result.bigend.vect[2] >> 2;
              if (-1 < result.bigend.vect[2]) {
                uVar7 = (uint)result.bigend.vect[2] >> 2;
              }
            }
            else if (iVar13 == 2) {
              uVar7 = result.bigend.vect[2] >> 1;
              if (-1 < result.bigend.vect[2]) {
                uVar7 = (uint)result.bigend.vect[2] >> 1;
              }
            }
            else if (result.bigend.vect[2] < 0) {
              uVar7 = ~(~result.bigend.vect[2] / iVar13);
            }
            else {
              uVar7 = result.bigend.vect[2] / iVar13;
            }
          }
          result.bigend.vect[0] = uVar8 + bx.smallend.vect[0];
          result.bigend.vect[1] = uVar11 + bx.smallend.vect[1];
          uVar8 = uVar7 + bx.smallend.vect[2];
        }
        result.bigend.vect[2] = uVar8;
      }
      bx.bigend.vect[1] = result.bigend.vect[1];
      bx.bigend.vect[2] = result.bigend.vect[2];
      bx.btype = result.btype;
      bx.smallend.vect[0] = result.smallend.vect[0];
      bx.smallend.vect[1] = result.smallend.vect[1];
      bx.smallend.vect[2] = result.smallend.vect[2];
      bx.bigend.vect[0] = result.bigend.vect[0];
      for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
        uVar8 = 1 << ((byte)lVar12 & 0x1f);
        uVar11 = (uint)lVar12;
        bx.bigend.vect[lVar12] =
             (bx.bigend.vect[lVar12] + (uint)((IVar6.itype >> (uVar11 & 0x1f) & 1) != 0)) -
             (uint)((bx.btype.itype >> (uVar11 & 0x1f) & 1) != 0);
        if ((IVar6.itype >> (uVar11 & 0x1f) & 1) == 0) {
          bx.btype.itype = ~uVar8 & bx.btype.itype;
        }
        else {
          bx.btype.itype = uVar8 | bx.btype.itype;
        }
      }
      LVar10 = Box::numPts(&bx);
      LVar15 = LVar15 + LVar10;
    }
  }
  return LVar15;
}

Assistant:

Long
BoxArray::numPts () const noexcept
{
    Long result = 0;
    const int N = size();
    auto const& bxs = this->m_ref->m_abox;
    if (m_bat.is_null()) {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += bxs[i].numPts();
        }
    } else if (m_bat.is_simple()) {
        IndexType t = ixType();
        IntVect cr = crseRatio();
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += amrex::convert(amrex::coarsen(bxs[i],cr),t).numPts();
        }
    } else {
#ifdef AMREX_USE_OMP
#pragma omp parallel for reduction(+:result)
#endif
        for (int i = 0; i < N; ++i)
        {
            result += m_bat.m_op.m_bndryReg(bxs[i]).numPts();
        }
    }

    return result;
}